

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZnode.cpp
# Opt level: O2

void __thiscall
chrono::ChLoadXYZnodeBody::ChLoadXYZnodeBody
          (ChLoadXYZnodeBody *this,shared_ptr<chrono::ChNodeXYZ> *mnodeA,
          shared_ptr<chrono::ChBody> *mbodyB)

{
  double dVar1;
  ChFrame<double> abs_application;
  shared_ptr<chrono::ChLoadable> sStack_f8;
  __shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2> local_e8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  ChQuaternion<double> local_d8;
  ChFrame<double> local_b0;
  
  std::__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChNodeXYZ,void>
            (local_e8,&mnodeA->super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBody,void>
            ((__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2> *)&sStack_f8,
             &mbodyB->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
  ChLoadCustomMultiple::ChLoadCustomMultiple
            (&this->super_ChLoadCustomMultiple,(shared_ptr<chrono::ChLoadable> *)local_e8,&sStack_f8
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sStack_f8.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0);
  (this->super_ChLoadCustomMultiple).super_ChLoadBase.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadXYZnodeBody_0116d720;
  local_b0._vptr_ChFrame = (_func_int **)&DAT_3ff0000000000000;
  local_d8.m_data[2] = 0.0;
  local_b0.coord.pos.m_data[2] = 0.0;
  local_d8.m_data[0] = 0.0;
  local_d8.m_data[1] = 0.0;
  local_b0.coord.pos.m_data[0] = 0.0;
  local_b0.coord.pos.m_data[1] = 0.0;
  ChFrame<double>::ChFrame
            (&this->loc_application_B,(ChVector<double> *)&local_d8,
             (ChQuaternion<double> *)&local_b0);
  (this->computed_loc_force).m_data[2] = 0.0;
  (this->computed_loc_force).m_data[0] = 0.0;
  (this->computed_loc_force).m_data[1] = 0.0;
  local_b0._vptr_ChFrame = (_func_int **)&DAT_3ff0000000000000;
  local_d8.m_data[2] = 0.0;
  local_b0.coord.pos.m_data[2] = 0.0;
  local_d8.m_data[0] = 0.0;
  local_d8.m_data[1] = 0.0;
  local_b0.coord.pos.m_data[0] = 0.0;
  local_b0.coord.pos.m_data[1] = 0.0;
  ChFrameMoving<double>::ChFrameMoving
            (&this->frame_Aw,(ChVector<double> *)&local_d8,(ChQuaternion<double> *)&local_b0);
  local_b0._vptr_ChFrame = (_func_int **)&DAT_3ff0000000000000;
  local_d8.m_data[2] = 0.0;
  local_b0.coord.pos.m_data[2] = 0.0;
  local_d8.m_data[0] = 0.0;
  local_d8.m_data[1] = 0.0;
  local_b0.coord.pos.m_data[0] = 0.0;
  local_b0.coord.pos.m_data[1] = 0.0;
  ChFrameMoving<double>::ChFrameMoving
            (&this->frame_Bw,(ChVector<double> *)&local_d8,(ChQuaternion<double> *)&local_b0);
  local_d8.m_data[0] = 1.0;
  local_d8.m_data[3] = 0.0;
  local_d8.m_data[1] = 0.0;
  local_d8.m_data[2] = 0.0;
  ChFrame<double>::ChFrame
            (&local_b0,
             &((mnodeA->super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              pos,&local_d8);
  ChFrame<double>::TransformParentToLocal
            ((ChFrame<double> *)
             &((mbodyB->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_ChBodyFrame,&local_b0,&this->loc_application_B);
  dVar1 = DAT_011dd3e0;
  if (this != (ChLoadXYZnodeBody *)(Q_ROTATE_Y_TO_Z + 0x18)) {
    (this->computed_loc_force).m_data[0] = VNULL;
    (this->computed_loc_force).m_data[1] = dVar1;
    (this->computed_loc_force).m_data[2] = DAT_011dd3e8;
  }
  return;
}

Assistant:

ChLoadXYZnodeBody::ChLoadXYZnodeBody(std::shared_ptr<ChNodeXYZ> mnodeA,
									 std::shared_ptr<ChBody> mbodyB)
					: ChLoadCustomMultiple(mnodeA, mbodyB) {
	ChFrame<> abs_application(mnodeA->GetPos());
    mbodyB->ChFrame::TransformParentToLocal(abs_application, loc_application_B);
	computed_loc_force = VNULL;
}